

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O0

ON_ComponentStatus * BrepComponentStatus(ON_Brep *brep,ON_COMPONENT_INDEX component_index)

{
  int iVar1;
  ON_BrepVertex *pOVar2;
  ON_BrepEdge *pOVar3;
  ON_BrepTrim *pOVar4;
  ON_BrepLoop *pOVar5;
  ON_BrepFace *pOVar6;
  ON_Brep *brep_local;
  ON_COMPONENT_INDEX component_index_local;
  
  brep_local._4_4_ = component_index.m_index;
  if (-1 < (long)component_index) {
    brep_local._0_4_ = component_index.m_type;
    switch((TYPE)brep_local) {
    case brep_vertex:
      iVar1 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&brep->m_V);
      if (brep_local._4_4_ < iVar1) {
        pOVar2 = ON_ClassArray<ON_BrepVertex>::operator[]
                           ((ON_ClassArray<ON_BrepVertex> *)&brep->m_V,brep_local._4_4_);
        return &pOVar2->m_status;
      }
      break;
    case brep_edge:
      iVar1 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&brep->m_E);
      if (brep_local._4_4_ < iVar1) {
        pOVar3 = ON_ClassArray<ON_BrepEdge>::operator[]
                           ((ON_ClassArray<ON_BrepEdge> *)&brep->m_E,brep_local._4_4_);
        return &pOVar3->m_status;
      }
      break;
    case brep_face:
      iVar1 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&brep->m_F);
      if (brep_local._4_4_ < iVar1) {
        pOVar6 = ON_ClassArray<ON_BrepFace>::operator[]
                           ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,brep_local._4_4_);
        return &pOVar6->m_status;
      }
      break;
    case brep_trim:
      iVar1 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&brep->m_T);
      if (brep_local._4_4_ < iVar1) {
        pOVar4 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&brep->m_T,brep_local._4_4_);
        return &pOVar4->m_status;
      }
      break;
    case brep_loop:
      iVar1 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&brep->m_L);
      if (brep_local._4_4_ < iVar1) {
        pOVar5 = ON_ClassArray<ON_BrepLoop>::operator[]
                           ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,brep_local._4_4_);
        return &pOVar5->m_status;
      }
    }
  }
  return (ON_ComponentStatus *)0x0;
}

Assistant:

static ON_ComponentStatus* BrepComponentStatus(
  const ON_Brep& brep,
  ON_COMPONENT_INDEX component_index
  )
{
  if (component_index.m_index >= 0)
  {
    switch (component_index.m_type)
    {
    case ON_COMPONENT_INDEX::TYPE::brep_vertex:
      if ( component_index.m_index < brep.m_V.Count() )
        return &brep.m_V[component_index.m_index].m_status;
      break;
    case ON_COMPONENT_INDEX::TYPE::brep_edge:
      if ( component_index.m_index < brep.m_E.Count() )
        return &brep.m_E[component_index.m_index].m_status;
      break;
    case ON_COMPONENT_INDEX::TYPE::brep_trim:
      if ( component_index.m_index < brep.m_T.Count() )
        return &brep.m_T[component_index.m_index].m_status;
      break;
    case ON_COMPONENT_INDEX::TYPE::brep_loop:
      if ( component_index.m_index < brep.m_L.Count() )
        return &brep.m_L[component_index.m_index].m_status;
      break;
    case ON_COMPONENT_INDEX::TYPE::brep_face:
      if ( component_index.m_index < brep.m_F.Count() )
        return &brep.m_F[component_index.m_index].m_status;
      break;
    default:
      break;
    }
  }
  return nullptr;
}